

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O2

CURLcode pop3_multi_statemach(connectdata *conn,_Bool *done)

{
  _Bool *done_00;
  CURLcode CVar1;
  
  if (((conn->handler->flags & 1) != 0) && ((conn->proto).imapc.ssldone == false)) {
    done_00 = &(conn->proto).imapc.ssldone;
    CVar1 = Curl_ssl_connect_nonblocking(conn,0,done_00);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    if (*done_00 != true) {
      return CURLE_OK;
    }
  }
  CVar1 = Curl_pp_statemach(&(conn->proto).ftpc.pp,false);
  *done = (conn->proto).imapc.state == IMAP_STOP;
  return CVar1;
}

Assistant:

static CURLcode pop3_multi_statemach(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;
  struct pop3_conn *pop3c = &conn->proto.pop3c;

  if((conn->handler->flags & PROTOPT_SSL) && !pop3c->ssldone) {
    result = Curl_ssl_connect_nonblocking(conn, FIRSTSOCKET, &pop3c->ssldone);
    if(result || !pop3c->ssldone)
      return result;
  }

  result = Curl_pp_statemach(&pop3c->pp, FALSE);
  *done = (pop3c->state == POP3_STOP) ? TRUE : FALSE;

  return result;
}